

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

string * __thiscall
ExpressionInternal::formatFunctionCall_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionInternal *this)

{
  ulong uVar1;
  StringLiteral *this_00;
  string *__lhs;
  size_type sVar2;
  reference this_01;
  pointer this_02;
  string local_70;
  ulong local_40;
  size_t i;
  string text;
  ExpressionInternal *this_local;
  
  text.field_2._8_8_ = this;
  this_00 = valueAs<StringLiteral>(this);
  __lhs = StringLiteral::string_abi_cxx11_(this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,__lhs,"(");
  local_40 = 0;
  while( true ) {
    uVar1 = local_40;
    sVar2 = std::
            vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ::size(&this->children);
    if (sVar2 <= uVar1) break;
    if (local_40 != 0) {
      std::__cxx11::string::operator+=((string *)&i,",");
    }
    this_01 = std::
              vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
              ::operator[](&this->children,local_40);
    this_02 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
              operator->(this_01);
    toString_abi_cxx11_(&local_70,this_02);
    std::__cxx11::string::operator+=((string *)&i,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_40 = local_40 + 1;
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,")");
  std::__cxx11::string::~string((string *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionInternal::formatFunctionCall()
{
	std::string text = valueAs<StringLiteral>().string() + "(";

	for (size_t i = 0; i < children.size(); i++)
	{
		if (i != 0)
			text += ",";
		text += children[i]->toString();
	}

	return text + ")";
}